

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  bool bVar1;
  U32 UVar2;
  U32 UVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,litLength);
  UVar3 = 0x800;
  if (((int)plVar4[0xc] != 2) && (UVar3 = 0x600, (int)plVar4[10] != 1)) {
    UVar3 = *(U32 *)(plVar4 + 8);
    bVar1 = true;
    while (bVar1) {
      UVar2 = *(U32 *)(*plVar4 + (ulong)*literals * 4);
      if ((int)optPtr == 0) {
        UVar2 = ZSTD_bitWeight(UVar2);
        if (*(uint *)(plVar4 + 8) < UVar2) goto LAB_00154871;
        UVar2 = ZSTD_bitWeight(*(U32 *)(*plVar4 + (ulong)*literals * 4));
      }
      else {
        UVar2 = ZSTD_fracWeight(UVar2);
        if (*(uint *)(plVar4 + 8) < UVar2) {
LAB_00154871:
          __assert_fail("WEIGHT(optPtr->litFreq[literals[u]], optLevel) <= optPtr->litSumBasePrice",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x467d,
                        "U32 ZSTD_rawLiteralsCost(const BYTE *const, const U32, const optState_t *const, int)"
                       );
        }
        UVar2 = ZSTD_fracWeight(*(U32 *)(*plVar4 + (ulong)*literals * 4));
      }
      UVar3 = UVar3 - UVar2;
      bVar1 = false;
    }
  }
  return UVar3;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = litLength * optPtr->litSumBasePrice;
        U32 u;
        for (u=0; u < litLength; u++) {
            assert(WEIGHT(optPtr->litFreq[literals[u]], optLevel) <= optPtr->litSumBasePrice);   /* literal cost should never be negative */
            price -= WEIGHT(optPtr->litFreq[literals[u]], optLevel);
        }
        return price;
    }
}